

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O2

int hmac(SHAversion whichSha,uchar *text,int text_len,uchar *key,int key_len,uint8_t *digest)

{
  int iVar1;
  int iVar2;
  HMACContext ctx;
  
  iVar1 = hmacReset(&ctx,whichSha,key,key_len);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar1 = USHAInput(&ctx.shaContext,text,text_len);
    if (iVar1 == 0) {
      iVar2 = hmacResult(&ctx,digest);
    }
  }
  return iVar2;
}

Assistant:

int hmac(SHAversion whichSha, const unsigned char *text, int text_len,
    const unsigned char *key, int key_len,
    uint8_t digest[USHAMaxHashSize])
{
    HMACContext ctx;
    return hmacReset(&ctx, whichSha, key, key_len) ||
        hmacInput(&ctx, text, text_len) ||
        hmacResult(&ctx, digest);
}